

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartInputFile.cpp
# Opt level: O2

void __thiscall
Imf_2_5::MultiPartInputFile::Data::readChunkOffsetTables
          (Data *this,bool reconstructChunkOffsetTable)

{
  vector<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_> *parts;
  InputPartData *pIVar1;
  uint uVar2;
  pointer ppIVar3;
  byte bVar4;
  int j;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  
  parts = &this->parts;
  ppIVar3 = (this->parts).
            super__Vector_base<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar7 = 0;
  bVar4 = 0;
  do {
    if ((ulong)((long)(this->parts).
                      super__Vector_base<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar3 >> 3) <= uVar7) {
      if ((reconstructChunkOffsetTable & bVar4) != 0) {
        chunkOffsetReconstruction(this,(this->super_InputStreamMutex).is,parts);
        return;
      }
      return;
    }
    uVar2 = getChunkOffsetTableSize(&ppIVar3[uVar7]->header,false);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (&(parts->
                super__Vector_base<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_>
                )._M_impl.super__Vector_impl_data._M_start[uVar7]->chunkOffsets,(long)(int)uVar2);
    if ((int)uVar2 < 1) {
      uVar2 = 0;
    }
    for (lVar6 = 0; (ulong)uVar2 * 8 - lVar6 != 0; lVar6 = lVar6 + 8) {
      Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>
                ((this->super_InputStreamMutex).is,
                 (unsigned_long *)
                 (*(long *)&((this->parts).
                             super__Vector_base<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar7]->chunkOffsets).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data + lVar6));
    }
    ppIVar3 = (parts->
              super__Vector_base<Imf_2_5::InputPartData_*,_std::allocator<Imf_2_5::InputPartData_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pIVar1 = ppIVar3[uVar7];
    pIVar1->completed = true;
    uVar5 = 0;
    do {
      if (uVar2 == uVar5) goto LAB_00465703;
      lVar6 = uVar5 * 8;
      uVar5 = uVar5 + 1;
    } while (*(long *)(*(long *)&(pIVar1->chunkOffsets).
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data + lVar6) != 0);
    pIVar1->completed = false;
    bVar4 = 1;
LAB_00465703:
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void
MultiPartInputFile::Data::readChunkOffsetTables(bool reconstructChunkOffsetTable)
{
    bool brokenPartsExist = false;

    for (size_t i = 0; i < parts.size(); i++)
    {
        int chunkOffsetTableSize = getChunkOffsetTableSize(parts[i]->header);
        parts[i]->chunkOffsets.resize(chunkOffsetTableSize);

        for (int j = 0; j < chunkOffsetTableSize; j++)
            OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (*is, parts[i]->chunkOffsets[j]);

        //
        // Check chunk offsets, reconstruct if broken.
        // At first we assume the table is complete.
        //
        parts[i]->completed = true;
        for (int j = 0; j < chunkOffsetTableSize; j++)
        {
            if (parts[i]->chunkOffsets[j] <= 0)
            {
                brokenPartsExist = true;
                parts[i]->completed = false;
                break;
            }
        }
    }

    if (brokenPartsExist && reconstructChunkOffsetTable)
        chunkOffsetReconstruction(*is, parts);
}